

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::queryReplaceOrder(Application *this)

{
  bool bVar1;
  int iVar2;
  ostream *this_00;
  void *this_01;
  allocator<char> local_9d9;
  string local_9d8 [39];
  allocator<char> local_9b1;
  string local_9b0;
  OrderCancelReplaceRequest local_990;
  OrderCancelReplaceRequest local_838;
  OrderCancelReplaceRequest local_6e0;
  OrderCancelReplaceRequest local_588;
  OrderCancelReplaceRequest local_430;
  OrderCancelReplaceRequest local_2c8;
  Message local_170 [8];
  Message replace;
  int version;
  Application *this_local;
  
  iVar2 = queryVersion(this);
  std::operator<<((ostream *)&std::cout,"\nCancelReplaceRequest\n");
  FIX::Message::Message(local_170);
  switch(iVar2) {
  case 0x28:
    queryCancelReplaceRequest40(&local_2c8,this);
    FIX::Message::operator=(local_170,(Message *)&local_2c8);
    FIX40::OrderCancelReplaceRequest::~OrderCancelReplaceRequest(&local_2c8);
    break;
  case 0x29:
    queryCancelReplaceRequest41(&local_430,this);
    FIX::Message::operator=(local_170,(Message *)&local_430);
    FIX41::OrderCancelReplaceRequest::~OrderCancelReplaceRequest(&local_430);
    break;
  case 0x2a:
    queryCancelReplaceRequest42(&local_588,this);
    FIX::Message::operator=(local_170,(Message *)&local_588);
    FIX42::OrderCancelReplaceRequest::~OrderCancelReplaceRequest(&local_588);
    break;
  case 0x2b:
    queryCancelReplaceRequest43(&local_6e0,this);
    FIX::Message::operator=(local_170,(Message *)&local_6e0);
    FIX43::OrderCancelReplaceRequest::~OrderCancelReplaceRequest(&local_6e0);
    break;
  case 0x2c:
    queryCancelReplaceRequest44(&local_838,this);
    FIX::Message::operator=(local_170,(Message *)&local_838);
    FIX44::OrderCancelReplaceRequest::~OrderCancelReplaceRequest(&local_838);
    break;
  default:
    this_00 = std::operator<<((ostream *)&std::cerr,"No test for version ");
    this_01 = (void *)std::ostream::operator<<(this_00,iVar2);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    break;
  case 0x32:
    queryCancelReplaceRequest50(&local_990,this);
    FIX::Message::operator=(local_170,(Message *)&local_990);
    FIX50::OrderCancelReplaceRequest::~OrderCancelReplaceRequest(&local_990);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b0,"Send replace",&local_9b1)
  ;
  bVar1 = queryConfirm(this,&local_9b0);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_9d8,"",&local_9d9);
    FIX::Session::sendToTarget(local_170,local_9d8);
    std::__cxx11::string::~string(local_9d8);
    std::allocator<char>::~allocator(&local_9d9);
  }
  FIX::Message::~Message(local_170);
  return;
}

Assistant:

void Application::queryReplaceOrder() {
  int version = queryVersion();
  std::cout << "\nCancelReplaceRequest\n";
  FIX::Message replace;

  switch (version) {
  case 40:
    replace = queryCancelReplaceRequest40();
    break;
  case 41:
    replace = queryCancelReplaceRequest41();
    break;
  case 42:
    replace = queryCancelReplaceRequest42();
    break;
  case 43:
    replace = queryCancelReplaceRequest43();
    break;
  case 44:
    replace = queryCancelReplaceRequest44();
    break;
  case 50:
    replace = queryCancelReplaceRequest50();
    break;
  default:
    std::cerr << "No test for version " << version << std::endl;
    break;
  }

  if (queryConfirm("Send replace")) {
    FIX::Session::sendToTarget(replace);
  }
}